

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

size_t burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                 (TSTNode<unsigned_short> *node,uchar **strings,size_t pos,size_t depth)

{
  TSTNode<unsigned_short> *pTVar1;
  void *pvVar2;
  void *pvVar3;
  int depth_00;
  size_t sVar4;
  long lVar5;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buck_2;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buck;
  
  pTVar1 = (TSTNode<unsigned_short> *)(node->buckets)._M_elems[0];
  depth_00 = (int)depth;
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
    if (pTVar1 != (TSTNode<unsigned_short> *)0x0) {
      pvVar2 = (pTVar1->buckets)._M_elems[0];
      pvVar3 = (pTVar1->buckets)._M_elems[1];
      lVar5 = (long)pvVar3 - (long)pvVar2 >> 3;
      sVar4 = (long)pvVar3 - (long)pvVar2;
      if (sVar4 != 0) {
        memmove(strings + pos,pvVar2,sVar4);
      }
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
                ((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)pTVar1);
      operator_delete(pTVar1);
      mkqsort(strings + pos,(int)lVar5,depth_00);
      pos = pos + lVar5;
    }
  }
  else {
    pos = burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (pTVar1,strings,pos,depth);
    operator_delete(pTVar1);
  }
  pTVar1 = (TSTNode<unsigned_short> *)(node->buckets)._M_elems[1];
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
    if (pTVar1 != (TSTNode<unsigned_short> *)0x0) {
      pvVar2 = (pTVar1->buckets)._M_elems[0];
      pvVar3 = (pTVar1->buckets)._M_elems[1];
      sVar4 = (long)pvVar3 - (long)pvVar2;
      if (sVar4 != 0) {
        memmove(strings + pos,pvVar2,sVar4);
      }
      lVar5 = (long)pvVar3 - (long)pvVar2 >> 3;
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
                ((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)pTVar1);
      operator_delete(pTVar1);
      if ((char)node->pivot != '\0') {
        mkqsort(strings + pos,(int)lVar5,depth_00 + 2);
      }
      pos = pos + lVar5;
    }
  }
  else {
    pos = burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (pTVar1,strings,pos,depth + 2);
    operator_delete(pTVar1);
  }
  pTVar1 = (TSTNode<unsigned_short> *)(node->buckets)._M_elems[2];
  if (((node->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
    if (pTVar1 != (TSTNode<unsigned_short> *)0x0) {
      pvVar2 = (pTVar1->buckets)._M_elems[0];
      pvVar3 = (pTVar1->buckets)._M_elems[1];
      lVar5 = (long)pvVar3 - (long)pvVar2 >> 3;
      sVar4 = (long)pvVar3 - (long)pvVar2;
      if (sVar4 != 0) {
        memmove(strings + pos,pvVar2,sVar4);
      }
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
                ((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)pTVar1);
      operator_delete(pTVar1);
      mkqsort(strings + pos,(int)lVar5,depth_00);
      pos = pos + lVar5;
    }
  }
  else {
    pos = burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (pTVar1,strings,pos,depth);
    operator_delete(pTVar1);
  }
  return pos;
}

Assistant:

static inline size_t
burst_traverse(TSTNode<CharT>* node,
               unsigned char** strings,
               size_t pos,
               size_t depth)
{
	pos = handle_bucket<0, BucketT>(node, strings, pos, depth);
	pos = handle_bucket<1, BucketT>(node, strings, pos, depth);
	pos = handle_bucket<2, BucketT>(node, strings, pos, depth);
	return pos;
}